

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

iterator * __thiscall
density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::iterator
::operator++(iterator *this)

{
  ControlBlock *i_control;
  void *pvVar1;
  
  i_control = next_valid(this->m_queue,this->m_control);
  this->m_control = i_control;
  if (i_control != (ControlBlock *)0x0) {
    pvVar1 = heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             get_element(i_control);
    (this->m_value).m_pair.m_address = pvVar1;
    (this->m_value).m_pair.m_type.m_feature_table = (tuple_type *)i_control[1].m_next;
  }
  return this;
}

Assistant:

iterator & operator++() noexcept
            {
                DENSITY_ASSUME(m_queue != nullptr);
                m_control = m_queue->next_valid(m_control);
                if (m_control != nullptr)
                {
                    RUNTIME_TYPE & type = *type_after_control(m_control);
                    new (&m_value.m_pair) value_type(type, get_element(m_control));
                }
                return *this;
            }